

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O2

void OPENSSL_lh_free(_LHASH *lh)

{
  lhash_item_st *plVar1;
  LHASH_ITEM *orig_ptr;
  size_t i;
  ulong uVar2;
  
  if (lh != (_LHASH *)0x0) {
    for (uVar2 = 0; uVar2 < lh->num_buckets; uVar2 = uVar2 + 1) {
      orig_ptr = lh->buckets[uVar2];
      while (orig_ptr != (LHASH_ITEM *)0x0) {
        plVar1 = orig_ptr->next;
        OPENSSL_free(orig_ptr);
        orig_ptr = plVar1;
      }
    }
    OPENSSL_free(lh->buckets);
    OPENSSL_free(lh);
    return;
  }
  return;
}

Assistant:

void OPENSSL_lh_free(_LHASH *lh) {
  if (lh == NULL) {
    return;
  }

  for (size_t i = 0; i < lh->num_buckets; i++) {
    LHASH_ITEM *next;
    for (LHASH_ITEM *n = lh->buckets[i]; n != NULL; n = next) {
      next = n->next;
      OPENSSL_free(n);
    }
  }

  OPENSSL_free(lh->buckets);
  OPENSSL_free(lh);
}